

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::expanded_convert(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  long lVar13;
  uint8 *puVar14;
  long lVar15;
  uint8 *puVar16;
  int iVar17;
  
  if (0 < this->m_max_mcus_per_row) {
    puVar14 = this->m_pScan_line_0;
    uVar7 = this->m_max_mcu_y_size - this->m_mcu_lines_left;
    uVar9 = uVar7 + 7;
    if (-1 < (int)uVar7) {
      uVar9 = uVar7;
    }
    pbVar10 = this->m_pSample_buf +
              (ulong)(uVar7 & 7) * 8 + (long)this->m_comp_h_samp[0] * (long)((int)uVar9 >> 3) * 0x40
    ;
    iVar6 = this->m_max_mcus_per_row;
    do {
      if (0 < this->m_max_mcu_x_size) {
        lVar13 = 0;
        pbVar11 = pbVar10;
        do {
          puVar16 = puVar14;
          iVar4 = this->m_expanded_blocks_per_component;
          lVar15 = 0;
          pbVar12 = pbVar11;
          do {
            bVar1 = *pbVar12;
            bVar2 = pbVar12[(long)iVar4 * 0x80];
            iVar8 = this->m_crr[bVar2] + (uint)bVar1;
            if (iVar8 < 1) {
              iVar8 = 0;
            }
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            bVar3 = pbVar12[(long)iVar4 * 0x40];
            puVar16[lVar15] = (uint8)iVar8;
            iVar8 = (this->m_cbg[bVar3] + this->m_crg[bVar2] >> 0x10) + (uint)bVar1;
            if (iVar8 < 1) {
              iVar8 = 0;
            }
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            puVar16[lVar15 + 1] = (uint8)iVar8;
            iVar17 = (uint)bVar1 + this->m_cbb[bVar3];
            iVar8 = 0;
            if (0 < iVar17) {
              iVar8 = iVar17;
            }
            if (0xfe < iVar8) {
              iVar8 = 0xff;
            }
            puVar16[lVar15 + 2] = (uint8)iVar8;
            puVar16[lVar15 + 3] = 0xff;
            pbVar12 = pbVar12 + 1;
            lVar15 = lVar15 + 4;
          } while (lVar15 != 0x20);
          lVar13 = lVar13 + 8;
          pbVar11 = pbVar11 + 0x40;
          puVar14 = puVar16 + 0x20;
        } while (lVar13 < this->m_max_mcu_x_size);
        puVar14 = puVar16 + 0x20;
      }
      pbVar10 = pbVar10 + (long)this->m_expanded_blocks_per_mcu * 0x40;
      bVar5 = 1 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

void jpeg_decoder::expanded_convert()
{
  int row = m_max_mcu_y_size - m_mcu_lines_left;

  uint8* Py = m_pSample_buf + (row / 8) * 64 * m_comp_h_samp[0] + (row & 7) * 8;

  uint8* d = m_pScan_line_0;

  for (int i = m_max_mcus_per_row; i > 0; i--)
  {
    for (int k = 0; k < m_max_mcu_x_size; k += 8)
    {
      const int Y_ofs = k * 8;
      const int Cb_ofs = Y_ofs + 64 * m_expanded_blocks_per_component;
      const int Cr_ofs = Y_ofs + 64 * m_expanded_blocks_per_component * 2;
      for (int j = 0; j < 8; j++)
      {
        int y = Py[Y_ofs + j];
        int cb = Py[Cb_ofs + j];
        int cr = Py[Cr_ofs + j];

        d[0] = clamp(y + m_crr[cr]);
        d[1] = clamp(y + ((m_crg[cr] + m_cbg[cb]) >> 16));
        d[2] = clamp(y + m_cbb[cb]);
        d[3] = 255;

        d += 4;
      }
    }

    Py += 64 * m_expanded_blocks_per_mcu;
  }
}